

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O3

void Fxu_ListMatrixDelSingle(Fxu_Matrix *p,Fxu_Single *pLink)

{
  int *piVar1;
  Fxu_Single *pFVar2;
  Fxu_Single *pFVar3;
  
  if ((p->lSingles).pHead == pLink) {
    (p->lSingles).pHead = pLink->pNext;
  }
  pFVar2 = pLink->pPrev;
  if ((p->lSingles).pTail == pLink) {
    (p->lSingles).pTail = pFVar2;
  }
  pFVar3 = pLink->pNext;
  if (pFVar2 != (Fxu_Single *)0x0) {
    pFVar2->pNext = pFVar3;
  }
  if (pFVar3 != (Fxu_Single *)0x0) {
    pFVar3->pPrev = pFVar2;
  }
  piVar1 = &(p->lSingles).nItems;
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void Fxu_ListMatrixDelSingle( Fxu_Matrix * p, Fxu_Single * pLink )
{
	Fxu_ListSingle * pList = &p->lSingles;
	if ( pList->pHead == pLink )
		 pList->pHead = pLink->pNext;
	if ( pList->pTail == pLink )
		 pList->pTail = pLink->pPrev;
	if ( pLink->pPrev )
		 pLink->pPrev->pNext = pLink->pNext;
	if ( pLink->pNext )
		 pLink->pNext->pPrev = pLink->pPrev;
	pList->nItems--;
}